

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
 mp::internal::ExprBase::
 Create<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
           (Impl *impl)

{
  AssertionFailure *this;
  
  if ((impl != (Impl *)0x0) && (3 < impl->kind_ - FIRST_ITERATED)) {
    this = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this,"invalid expression kind");
    __cxa_throw(this,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  return (BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>)
         (BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>)impl;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }